

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserTOIDecPOMDPDiscrete.cpp
# Opt level: O1

void __thiscall ParserTOIDecPOMDPDiscrete::ParseAgent(ParserTOIDecPOMDPDiscrete *this,Index id)

{
  MultiAgentDecisionProcessDiscrete *this_00;
  DecPOMDPDiscrete *this_01;
  long lVar1;
  undefined8 *puVar2;
  ParserDPOMDPFormat_Spirit parser;
  string local_1c8;
  string local_1a8;
  undefined1 local_188 [344];
  
  this_00 = (this->_m_problem->super_TransitionObservationIndependentMADPDiscrete).
            _m_individualMADPDs.
            super__Vector_base<MultiAgentDecisionProcessDiscrete_*,_std::allocator<MultiAgentDecisionProcessDiscrete_*>_>
            ._M_impl.super__Vector_impl_data._M_start[id];
  this_01 = (DecPOMDPDiscrete *)operator_new(0x230);
  local_188._0_8_ = local_188 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_188,"");
  local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"");
  MultiAgentDecisionProcess::GetProblemFile_abi_cxx11_
            (&local_1a8,&this_00->super_MultiAgentDecisionProcess);
  DecPOMDPDiscrete::DecPOMDPDiscrete(this_01,(string *)local_188,&local_1c8,&local_1a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_188._0_8_ != local_188 + 0x10) {
    operator_delete((void *)local_188._0_8_,local_188._16_8_ + 1);
  }
  MultiAgentDecisionProcessDiscrete::SetSparse
            ((MultiAgentDecisionProcessDiscrete *)this_01,this_00->_m_sparse);
  DPOMDPFormatParsing::ParserDPOMDPFormat_Spirit::ParserDPOMDPFormat_Spirit
            ((ParserDPOMDPFormat_Spirit *)local_188,this_01);
  DPOMDPFormatParsing::ParserDPOMDPFormat_Spirit::Parse((ParserDPOMDPFormat_Spirit *)local_188);
  lVar1 = (**(code **)(*(long *)&(this_01->super_MultiAgentDecisionProcessDiscrete).
                                 super_MultiAgentDecisionProcess + 0x10))(this_01);
  if (lVar1 == 1) {
    (*(this->super_ParserInterface)._vptr_ParserInterface[3])(this,this_01,id);
    DPOMDPFormatParsing::ParserDPOMDPFormat_Spirit::~ParserDPOMDPFormat_Spirit
              ((ParserDPOMDPFormat_Spirit *)local_188);
    return;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(0x28);
  *puVar2 = &PTR__E_0059bd80;
  puVar2[1] = puVar2 + 3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(puVar2 + 1),
             "ParserTOIDecPOMDPDiscrete::ParseAgent individual models can only be defined for a single agent"
             ,"");
  __cxa_throw(puVar2,&E::typeinfo,E::~E);
}

Assistant:

void ParserTOIDecPOMDPDiscrete::ParseAgent(Index id)
{
    MultiAgentDecisionProcessDiscrete* madp = 
        _m_problem->GetIndividualMADPD(id);

    DecPOMDPDiscrete *decpomdp;
    decpomdp=new DecPOMDPDiscrete("", "", madp->GetProblemFile());
    decpomdp->SetSparse(madp->GetSparse());

    DPOMDPFormatParsing::ParserDPOMDPFormat_Spirit parser(decpomdp);
    parser.Parse();

    if(decpomdp->GetNrAgents()!=1)
        throw(E("ParserTOIDecPOMDPDiscrete::ParseAgent individual models can only be defined for a single agent"));

    StoreDecPOMDP(decpomdp,id);
}